

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O3

void __thiscall
soul::FunctionBuilder::addBranch
          (FunctionBuilder *this,Block *target,ArgListType *targetArgs,
          pool_ptr<soul::heart::Block> *subsequentBlock)

{
  PoolItem *pPVar1;
  pool_ptr<soul::heart::Block> local_30;
  
  pPVar1 = PoolAllocator::allocateSpaceForObject
                     (&((this->super_BlockBuilder).module)->allocator->pool,0x58);
  *(undefined8 *)&pPVar1->field_0x18 = 0;
  pPVar1[1].size = 0;
  pPVar1->item = &PTR__Branch_002cfee0;
  pPVar1[1].destructor = (DestructorFn *)target;
  pPVar1[1].item = &pPVar1[2].destructor;
  *(undefined8 *)&pPVar1[1].field_0x18 = 0;
  pPVar1[2].size = 4;
  pPVar1->destructor =
       PoolAllocator::allocate<soul::heart::Branch,_soul::heart::Block_&>::anon_class_1_0_00000001::
       __invoke;
  ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::operator=
            ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)&pPVar1[1].item
             ,targetArgs);
  local_30 = (pool_ptr<soul::heart::Block>)subsequentBlock->object;
  addTerminatorStatement(this,(Terminator *)&pPVar1->item,&local_30);
  return;
}

Assistant:

void addBranch (heart::Block& target, heart::Branch::ArgListType&& targetArgs, pool_ptr<heart::Block> subsequentBlock)
    {
        auto& branch = module.allocate<heart::Branch> (target);

        branch.targetArgs = std::move (targetArgs);

        addTerminatorStatement (branch, subsequentBlock);
    }